

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O3

void __thiscall Clasp::ClaspFacade::SolveStrategy::startAlgo(SolveStrategy *this,SolveMode_t m)

{
  int *piVar1;
  int sig;
  ClaspFacade *pCVar2;
  bool more;
  ulong uVar3;
  double dVar4;
  
  (*this->_vptr_SolveStrategy[4])(this,0);
  pCVar2 = this->facade_;
  uVar3 = (pCVar2->solve_).ptr_ & 0xfffffffffffffffe;
  if (uVar3 != 0) {
    LOCK();
    piVar1 = (int *)(uVar3 + 0x58);
    sig = *piVar1;
    *piVar1 = 0;
    UNLOCK();
    if (sig != 0) {
      SolveData::interrupt((SolveData *)((pCVar2->solve_).ptr_ & 0xfffffffffffffffe),sig);
    }
  }
  if (((this->signal_).super___atomic_base<unsigned_int>._M_i == 0) &&
     (((*(this->facade_->ctx).solvers_.ebo_.buf)->conflict_).ebo_.size == 0)) {
    dVar4 = RealTime::getTime();
    pCVar2 = this->facade_;
    (pCVar2->step_).unsatTime = dVar4;
    (pCVar2->step_).solveTime = dVar4;
    if ((m.val_ & Yield) != Default) {
      SolveAlgorithm::start(this->algo_,&pCVar2->ctx,&pCVar2->assume_,&pCVar2->super_ModelHandler);
      return;
    }
    more = SolveAlgorithm::solve
                     (this->algo_,&pCVar2->ctx,&pCVar2->assume_,&pCVar2->super_ModelHandler);
  }
  else {
    SharedContext::report(&this->facade_->ctx,subsystem_solve);
    more = SharedContext::ok(&this->facade_->ctx);
  }
  detachAlgo(this,more,0,0);
  return;
}

Assistant:

void ClaspFacade::SolveStrategy::startAlgo(SolveMode_t m) {
	bool more = true, detach = true;
	doNotify(event_attach);
	try {
		facade_->interrupt(0); // handle pending interrupts
		if (!signal_ && !facade_->ctx.master()->hasConflict()) {
			facade_->step_.solveTime = facade_->step_.unsatTime = RealTime::getTime();
			if ((m & SolveMode_t::Yield) == 0) {
				more = algo_->solve(facade_->ctx, facade_->assume_, facade_);
			}
			else {
				algo_->start(facade_->ctx, facade_->assume_, facade_);
				detach = false;
			}
		}
		else {
			facade_->ctx.report(Clasp::Event::subsystem_solve);
			more = facade_->ctx.ok();
		}
		if (detach) { detach = false; detachAlgo(more, 0); }
	}
	catch (...) {
		if (detach) { detachAlgo(more, 1); }
		else        { throw; }
	}
}